

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O0

bool __thiscall
PrintVisitor::needParentheses(PrintVisitor *this,Expression *expression,OperatorChar op)

{
  CalculationEngine *this_00;
  bool bVar1;
  OperatorChar opChar;
  int iVar2;
  int iVar3;
  bool local_102;
  BinaryOperatorExpression *local_100;
  undefined1 local_c8 [8];
  Operator nodeOperator;
  Operator inputOperator;
  BinaryOperatorExpression *binaryOperatorExpression;
  Expression *expression_local;
  PrintVisitor *this_local;
  OperatorChar op_local;
  
  if (expression == (Expression *)0x0) {
    local_100 = (BinaryOperatorExpression *)0x0;
  }
  else {
    local_100 = (BinaryOperatorExpression *)
                __dynamic_cast(expression,&Expression::typeinfo,&BinaryOperatorExpression::typeinfo,
                               0);
  }
  if (local_100 != (BinaryOperatorExpression *)0x0) {
    Operator::Operator((Operator *)&nodeOperator.mUnaryFn._M_invoker);
    Operator::Operator((Operator *)local_c8);
    bVar1 = CalculationEngine::getBinaryOperator
                      (this->mCalcEngine,op,(Operator *)&nodeOperator.mUnaryFn._M_invoker);
    local_102 = false;
    if (bVar1) {
      this_00 = this->mCalcEngine;
      opChar = BinaryOperatorExpression::op(local_100);
      local_102 = CalculationEngine::getBinaryOperator(this_00,opChar,(Operator *)local_c8);
    }
    if (local_102 != false) {
      iVar2 = Operator::precedence((Operator *)&nodeOperator.mUnaryFn._M_invoker);
      iVar3 = Operator::precedence((Operator *)local_c8);
      this_local._7_1_ = iVar3 < iVar2;
    }
    Operator::~Operator((Operator *)local_c8);
    Operator::~Operator((Operator *)&nodeOperator.mUnaryFn._M_invoker);
    if (local_102 != false) goto LAB_001998c9;
  }
  this_local._7_1_ = 0;
LAB_001998c9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PrintVisitor::needParentheses(Expression* expression, OperatorChar op) {
	if (auto binaryOperatorExpression = dynamic_cast<BinaryOperatorExpression*>(expression)) {
		Operator inputOperator;
		Operator nodeOperator;
		if (mCalcEngine.getBinaryOperator(op, inputOperator)
			&& mCalcEngine.getBinaryOperator(binaryOperatorExpression->op(), nodeOperator)) {
			return inputOperator.precedence() > nodeOperator.precedence();
		}
	}

	return false;
}